

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O3

QString * QMakeInternal::IoUtils::resolvePath
                    (QString *__return_storage_ptr__,QString *baseDir,QString *fileName)

{
  char cVar1;
  long in_FS_OFFSET;
  QString local_50;
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_const_QString_&> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fileName->d).size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0026660a;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    cVar1 = QString::startsWith((QChar)(char16_t)fileName,0x2f);
    if (cVar1 == '\0') {
      local_38.a.b.ch = '/';
      local_38.a.a = baseDir;
      local_38.b = fileName;
      QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_const_QString_&>::
      convertTo<QString>(&local_50,&local_38);
      QDir::cleanPath((QString *)__return_storage_ptr__);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0026660a;
    }
    else {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_0026660a:
        __stack_chk_fail();
      }
      QDir::cleanPath((QString *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString IoUtils::resolvePath(const QString &baseDir, const QString &fileName)
{
    if (fileName.isEmpty())
        return QString();
    if (isAbsolutePath(fileName))
        return QDir::cleanPath(fileName);
#ifdef Q_OS_WIN // Add drive to otherwise-absolute path:
    if (fileName.at(0).unicode() == '/' || fileName.at(0).unicode() == '\\') {
        Q_ASSERT_X(isAbsolutePath(baseDir), "IoUtils::resolvePath", qUtf8Printable(baseDir));
        return QDir::cleanPath(baseDir.left(2) + fileName);
    }
#endif // Q_OS_WIN
    return QDir::cleanPath(baseDir + QLatin1Char('/') + fileName);
}